

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

Curl_dns_entry * Curl_cache_addr(Curl_easy *data,Curl_addrinfo *addr,char *hostname,int port)

{
  undefined8 uVar1;
  uint uVar2;
  CURLcode CVar3;
  undefined8 *puVar4;
  ulong uVar5;
  uchar *rnd;
  size_t sVar6;
  Curl_dns_entry *pCVar7;
  undefined4 in_register_0000000c;
  ulong buflen;
  ulong uVar8;
  char entry_id [262];
  
  buflen = CONCAT44(in_register_0000000c,port);
  if ((((data->set).field_0x8e7 & 0x10) != 0) && (uVar2 = Curl_num_addresses(addr), 1 < (int)uVar2))
  {
    Curl_infof(data,"Shuffling %i addresses",(ulong)uVar2);
    uVar8 = (ulong)uVar2;
    puVar4 = (undefined8 *)(*Curl_cmalloc)(uVar8 * 8);
    if (puVar4 == (undefined8 *)0x0) {
      return (Curl_dns_entry *)0x0;
    }
    *puVar4 = addr;
    for (uVar5 = 1; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      buflen = *(ulong *)(puVar4[uVar5 - 1] + 0x28);
      puVar4[uVar5] = buflen;
    }
    rnd = (uchar *)(*Curl_cmalloc)(uVar8 * 4);
    if (rnd != (uchar *)0x0) {
      CVar3 = Curl_rand(data,rnd,uVar8 * 4);
      if (CVar3 == CURLE_OK) {
        buflen = (ulong)(uVar2 - 1);
        for (uVar5 = buflen; 0 < (long)uVar5; uVar5 = uVar5 - 1) {
          uVar1 = puVar4[(ulong)*(uint *)(rnd + uVar5 * 4) % (ulong)uVar2];
          puVar4[(ulong)*(uint *)(rnd + uVar5 * 4) % (ulong)uVar2] = puVar4[uVar5];
          puVar4[uVar5] = uVar1;
          uVar2 = uVar2 - 1;
        }
        for (uVar5 = 1; uVar8 != uVar5; uVar5 = uVar5 + 1) {
          *(undefined8 *)(puVar4[uVar5 - 1] + 0x28) = puVar4[uVar5];
        }
        *(undefined8 *)(puVar4[buflen] + 0x28) = 0;
        addr = (Curl_addrinfo *)*puVar4;
      }
      (*Curl_cfree)(rnd);
    }
    (*Curl_cfree)(puVar4);
    if (rnd == (uchar *)0x0) {
      return (Curl_dns_entry *)0x0;
    }
  }
  puVar4 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
  if (puVar4 != (undefined8 *)0x0) {
    create_hostcache_id(hostname,port,entry_id,buflen);
    sVar6 = strlen(entry_id);
    puVar4[2] = 1;
    *puVar4 = addr;
    time(puVar4 + 1);
    if (puVar4[1] == 0) {
      puVar4[1] = 1;
    }
    pCVar7 = (Curl_dns_entry *)Curl_hash_add((data->dns).hostcache,entry_id,sVar6 + 1,puVar4);
    if (pCVar7 != (Curl_dns_entry *)0x0) {
      pCVar7->inuse = pCVar7->inuse + 1;
      return pCVar7;
    }
    (*Curl_cfree)(puVar4);
  }
  return (Curl_dns_entry *)0x0;
}

Assistant:

struct Curl_dns_entry *
Curl_cache_addr(struct Curl_easy *data,
                struct Curl_addrinfo *addr,
                const char *hostname,
                int port)
{
  char entry_id[MAX_HOSTCACHE_LEN];
  size_t entry_len;
  struct Curl_dns_entry *dns;
  struct Curl_dns_entry *dns2;

#ifndef CURL_DISABLE_SHUFFLE_DNS
  /* shuffle addresses if requested */
  if(data->set.dns_shuffle_addresses) {
    CURLcode result = Curl_shuffle_addr(data, &addr);
    if(result)
      return NULL;
  }
#endif

  /* Create a new cache entry */
  dns = calloc(1, sizeof(struct Curl_dns_entry));
  if(!dns) {
    return NULL;
  }

  /* Create an entry id, based upon the hostname and port */
  create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
  entry_len = strlen(entry_id);

  dns->inuse = 1;   /* the cache has the first reference */
  dns->addr = addr; /* this is the address(es) */
  time(&dns->timestamp);
  if(dns->timestamp == 0)
    dns->timestamp = 1;   /* zero indicates permanent CURLOPT_RESOLVE entry */

  /* Store the resolved data in our DNS cache. */
  dns2 = Curl_hash_add(data->dns.hostcache, entry_id, entry_len + 1,
                       (void *)dns);
  if(!dns2) {
    free(dns);
    return NULL;
  }

  dns = dns2;
  dns->inuse++;         /* mark entry as in-use */
  return dns;
}